

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadBitM_Binary
          (COBImporter *this,Scene *param_1,StreamReaderLE *reader,ChunkInfo *nfo)

{
  uint uVar1;
  int32_t iVar2;
  undefined1 local_40 [4];
  uint32_t len;
  chunk_guard cn;
  ChunkInfo *nfo_local;
  StreamReaderLE *reader_local;
  Scene *param_1_local;
  COBImporter *this_local;
  
  cn.cur = (long)nfo;
  if (nfo->version < 2) {
    chunk_guard::chunk_guard((chunk_guard *)local_40,nfo,reader);
    uVar1 = StreamReader<false,_false>::GetI4(reader);
    StreamReader<false,_false>::IncPtr(reader,(ulong)uVar1);
    StreamReader<false,_false>::GetI4(reader);
    iVar2 = StreamReader<false,_false>::GetI4(reader);
    StreamReader<false,_false>::IncPtr(reader,(long)iVar2);
    chunk_guard::~chunk_guard((chunk_guard *)local_40);
  }
  else {
    UnsupportedChunk_Binary(this,reader,nfo,"BitM");
  }
  return;
}

Assistant:

void COBImporter::ReadBitM_Binary(COB::Scene& /*out*/, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Binary(reader,nfo,"BitM");
    }

    const chunk_guard cn(nfo,reader);

    const uint32_t len = reader.GetI4();
    reader.IncPtr(len);

    reader.GetI4();
    reader.IncPtr(reader.GetI4());
}